

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmSourceFile *this_00;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  LocalGeneratorVector *this_01;
  reference this_02;
  pointer pcVar4;
  cmMakefile *this_03;
  GeneratorTargetVector *this_04;
  pointer pcVar5;
  string *psVar6;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  reference ppcVar7;
  cmSourceGroup *this_05;
  char *local_248;
  cmSourceGroup *sourceGroup;
  string *source;
  cmSourceFile *sf;
  iterator __end4;
  iterator __begin4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range4;
  string local_1c8;
  undefined1 local_1a8 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_170;
  char *local_150;
  char *prefix;
  cmAlphaNum local_118;
  undefined1 local_e8 [8];
  string linkName2;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  GeneratorTargetVector *targets;
  cmMakefile *makefile;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string linkName;
  cmXMLWriter *xml_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  linkName.field_2._8_8_ = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"[Targets]",&local_39);
  std::allocator<char>::~allocator(&local_39);
  uVar1 = linkName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"virtual:/virtual",(allocator<char> *)((long)&__range1 + 7));
  AppendLinkedResource((cmXMLWriter *)uVar1,(string *)local_38,&local_70,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_01);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&lg), bVar2) {
    this_02 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    pcVar4 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    this_03 = cmLocalGenerator::GetMakefile(pcVar4);
    pcVar4 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_02);
    this_04 = cmLocalGenerator::GetGeneratorTargets(pcVar4);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_04);
    target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
             std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::end(this_04);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&target), bVar2) {
      linkName2.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
           ::operator*(&__end2);
      cmAlphaNum::cmAlphaNum(&local_118,(string *)local_38);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&prefix,'/');
      cmStrCat<>((string *)local_e8,&local_118,(cmAlphaNum *)&prefix);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          linkName2.field_2._8_8_);
      TVar3 = cmGeneratorTarget::GetType(pcVar5);
      if (TVar3 < UTILITY) {
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)linkName2.field_2._8_8_);
        TVar3 = cmGeneratorTarget::GetType(pcVar5);
        if (TVar3 == EXECUTABLE) {
          local_248 = "[exe] ";
        }
        else {
          local_248 = "[lib] ";
        }
        local_150 = local_248;
        std::__cxx11::string::operator+=((string *)local_e8,local_248);
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)linkName2.field_2._8_8_);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar5);
        std::__cxx11::string::operator+=((string *)local_e8,(string *)psVar6);
        uVar1 = linkName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"virtual:/virtual",
                   (allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        AppendLinkedResource((cmXMLWriter *)uVar1,(string *)local_e8,&local_170,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        if ((this->GenerateLinkedResources & 1U) != 0) {
          __x = cmMakefile::GetSourceGroups(this_03);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                     &files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_1a8);
          pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)linkName2.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c8,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&__range4 + 7));
          psVar6 = cmMakefile::GetSafeDefinition(this_03,&local_1c8);
          cmGeneratorTarget::GetSourceFiles
                    (pcVar5,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_1a8,
                     psVar6);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          __end4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                             ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_1a8);
          sf = (cmSourceFile *)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_1a8);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                             *)&sf), bVar2) {
            ppcVar7 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&__end4);
            this_00 = *ppcVar7;
            psVar6 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
            this_05 = cmMakefile::FindSourceGroup
                                (this_03,psVar6,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                                 &files.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmSourceGroup::AssignSource(this_05,this_00);
            __gnu_cxx::
            __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&__end4);
          }
          WriteGroups(this,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                           &files.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_e8,
                      (cmXMLWriter *)linkName.field_2._8_8_);
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_1a8);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                     &files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      std::__cxx11::string::~string((string *)local_e8);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (const auto& lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();

    for (const auto& target : targets) {
      std::string linkName2 = cmStrCat(linkName, '/');
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          std::vector<cmSourceFile*> files;
          target->GetSourceFiles(
            files, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->ResolveFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}